

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

void deqp::gles31::Functional::generateVariableTypeResourceNames
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *resources,string *name,VarType *type,deUint32 resourceNameGenerationFlags)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  StructMember *pSVar5;
  char *__rhs;
  VarType *pVVar6;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  int local_ac;
  undefined1 local_a8 [4];
  int ndx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  StructType *pSStack_30;
  int ndx;
  StructType *structType;
  deUint32 childFlags;
  deUint32 resourceNameGenerationFlags_local;
  VarType *type_local;
  string *name_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resources_local;
  
  structType._0_4_ = resourceNameGenerationFlags & 0xfffffffe;
  structType._4_4_ = resourceNameGenerationFlags;
  _childFlags = type;
  type_local = (VarType *)name;
  name_local = (string *)resources;
  bVar3 = glu::VarType::isBasicType(type);
  if (bVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)name_local,(value_type *)type_local);
  }
  else {
    bVar3 = glu::VarType::isStructType(_childFlags);
    if (bVar3) {
      pSStack_30 = glu::VarType::getStructPtr(_childFlags);
      for (local_34 = 0; iVar1 = local_34, iVar4 = glu::StructType::getNumMembers(pSStack_30),
          psVar2 = name_local, iVar1 < iVar4; local_34 = local_34 + 1) {
        std::operator+(&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       type_local,".");
        pSVar5 = glu::StructType::getMember(pSStack_30,local_34);
        __rhs = glu::StructMember::getName(pSVar5);
        std::operator+(&local_58,&local_78,__rhs);
        pSVar5 = glu::StructType::getMember(pSStack_30,local_34);
        pVVar6 = glu::StructMember::getType(pSVar5);
        generateVariableTypeResourceNames
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar2,&local_58,pVVar6,(uint)structType);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
    else {
      bVar3 = glu::VarType::isArrayType(_childFlags);
      if (bVar3) {
        pVVar6 = glu::VarType::getElementType(_childFlags);
        bVar3 = glu::VarType::isBasicType(pVVar6);
        if ((bVar3) && ((structType._4_4_ & 2) != 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)name_local,(value_type *)type_local);
        }
        else {
          pVVar6 = glu::VarType::getElementType(_childFlags);
          bVar3 = glu::VarType::isBasicType(pVVar6);
          psVar2 = name_local;
          if ((bVar3) || ((structType._4_4_ & 1) != 0)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)type_local,"[0]");
            pVVar6 = glu::VarType::getElementType(_childFlags);
            generateVariableTypeResourceNames
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)psVar2,(string *)local_a8,pVVar6,(uint)structType);
            std::__cxx11::string::~string((string *)local_a8);
          }
          else {
            for (local_ac = 0; iVar1 = local_ac, iVar4 = glu::VarType::getArraySize(_childFlags),
                psVar2 = name_local, iVar1 < iVar4; local_ac = local_ac + 1) {
              std::operator+(&local_110,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             type_local,"[");
              de::toString<int>(&local_130,&local_ac);
              std::operator+(&local_f0,&local_110,&local_130);
              std::operator+(&local_d0,&local_f0,"]");
              pVVar6 = glu::VarType::getElementType(_childFlags);
              generateVariableTypeResourceNames
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)psVar2,&local_d0,pVVar6,(uint)structType);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_130);
              std::__cxx11::string::~string((string *)&local_110);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void generateVariableTypeResourceNames (std::vector<std::string>& resources, const std::string& name, const glu::VarType& type, deUint32 resourceNameGenerationFlags)
{
	DE_ASSERT((resourceNameGenerationFlags & (~RESOURCE_NAME_GENERATION_FLAG_MASK)) == 0);

	// remove top-level flag from children
	const deUint32 childFlags = resourceNameGenerationFlags & ~((deUint32)RESOURCE_NAME_GENERATION_FLAG_TOP_LEVEL_BUFFER_VARIABLE);

	if (type.isBasicType())
		resources.push_back(name);
	else if (type.isStructType())
	{
		const glu::StructType* structType = type.getStructPtr();
		for (int ndx = 0; ndx < structType->getNumMembers(); ++ndx)
			generateVariableTypeResourceNames(resources, name + "." + structType->getMember(ndx).getName(), structType->getMember(ndx).getType(), childFlags);
	}
	else if (type.isArrayType())
	{
		// Bottom-level arrays of basic types of a transform feedback variable will produce only the first
		// element but without the trailing "[0]"
		if (type.getElementType().isBasicType() &&
			(resourceNameGenerationFlags & RESOURCE_NAME_GENERATION_FLAG_TRANSFORM_FEEDBACK_VARIABLE) != 0)
		{
			resources.push_back(name);
		}
		// Bottom-level arrays of basic types and SSBO top-level arrays of any type procude only first element
		else if (type.getElementType().isBasicType() ||
				 (resourceNameGenerationFlags & RESOURCE_NAME_GENERATION_FLAG_TOP_LEVEL_BUFFER_VARIABLE) != 0)
		{
			generateVariableTypeResourceNames(resources, name + "[0]", type.getElementType(), childFlags);
		}
		// Other arrays of aggregate types are expanded
		else
		{
			for (int ndx = 0; ndx < type.getArraySize(); ++ndx)
				generateVariableTypeResourceNames(resources, name + "[" + de::toString(ndx) + "]", type.getElementType(), childFlags);
		}
	}
	else
		DE_ASSERT(false);
}